

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nrom.cpp
# Opt level: O2

uint8_t __thiscall n_e_s::core::Nrom::cpu_read_byte(Nrom *this,uint16_t addr)

{
  pointer puVar1;
  uint uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  bool bVar5;
  
  bVar5 = -1 < (short)addr;
  uVar2 = addr - 0x6000;
  if (!bVar5) {
    uVar2 = addr & 0x7fff;
  }
  pvVar4 = &this->prg_rom_;
  if (bVar5) {
    pvVar4 = &this->prg_ram_;
  }
  pvVar3 = &this->prg_ram_;
  if (!bVar5) {
    pvVar3 = &this->prg_rom_;
  }
  puVar1 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  return puVar1[((ulong)uVar2 & 0xffff) %
                (ulong)((long)(pvVar3->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1)];
}

Assistant:

uint8_t Nrom::cpu_read_byte(uint16_t addr) const {
    if (addr <= kPrgRamEnd) {
        addr -= kPrgRamStart;
        return prg_ram_[addr % prg_ram_.size()];
    }

    addr -= kPrgRomStart;
    return prg_rom_[addr % prg_rom_.size()];
}